

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O2

void newItem(string *path)

{
  int num_of_layers;
  int layers;
  int id;
  long lVar1;
  ostream *poVar2;
  undefined1 *puVar3;
  string *psVar4;
  string sStack_d38;
  char *local_d18;
  long local_d10;
  char *local_cf8;
  long local_cf0;
  string local_cd8;
  string names [100];
  
  lVar1 = 0x10;
  do {
    puVar3 = (undefined1 *)((long)&names[0]._M_dataplus._M_p + lVar1);
    *(undefined1 **)((long)names + lVar1 + -0x10) = puVar3;
    *(undefined8 *)((long)names + lVar1 + -8) = 0;
    *puVar3 = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0xc90);
  std::__cxx11::string::string((string *)&sStack_d38,(string *)path);
  num_of_layers = parsePath(&sStack_d38,names);
  std::__cxx11::string::~string((string *)&sStack_d38);
  std::__cxx11::string::string((string *)&local_cf8,(string *)path);
  layers = doesExist(names,num_of_layers,local_cf0 == 0 || *local_cf8 != '/');
  std::__cxx11::string::~string((string *)&local_cf8);
  if (layers == num_of_layers) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)path);
    std::operator<<(poVar2," already exists.\n");
  }
  else {
    std::__cxx11::string::string((string *)&local_d18,(string *)path);
    id = getId(names,layers,local_d10 == 0 || *local_d18 != '/');
    std::__cxx11::string::~string((string *)&local_d18);
    lVar1 = (long)layers;
    psVar4 = names + lVar1;
    for (; lVar1 < num_of_layers; lVar1 = lVar1 + 1) {
      std::__cxx11::string::string((string *)&local_cd8,(string *)psVar4);
      id = makeDirectoryById(id,&local_cd8);
      std::__cxx11::string::~string((string *)&local_cd8);
      psVar4 = psVar4 + 1;
    }
  }
  lVar1 = 0xc60;
  do {
    std::__cxx11::string::~string((string *)((long)&names[0]._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void newItem(string path) {
    string names[100];
    int layers = parsePath(path, names);
    int exist_layers;
    exist_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (exist_layers == layers)//执行mkdir却发现已经存在
    {
        setColor(COLOR_ERR);
        cout << path << " already exists.\n";
        setColor(COLOR_ORIGIN);
        return;
    }
    int id = getId(names, exist_layers, getPathType(path) == RELATIVE_PATH);
    for (int i = exist_layers; i < layers; i++) {
        id = makeDirectoryById(id, names[i]);
    }
}